

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currpinf.cpp
# Opt level: O0

void __thiscall
icu_63::CurrencyPluralInfo::CurrencyPluralInfo(CurrencyPluralInfo *this,CurrencyPluralInfo *info)

{
  CurrencyPluralInfo *info_local;
  CurrencyPluralInfo *this_local;
  
  UObject::UObject(&this->super_UObject,&info->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__CurrencyPluralInfo_004aeff8;
  this->fPluralCountToCurrencyUnitPattern = (Hashtable *)0x0;
  this->fPluralRules = (PluralRules *)0x0;
  this->fLocale = (Locale *)0x0;
  this->fInternalStatus = U_ZERO_ERROR;
  operator=(this,info);
  return;
}

Assistant:

CurrencyPluralInfo::CurrencyPluralInfo(const CurrencyPluralInfo& info) 
:   UObject(info),
    fPluralCountToCurrencyUnitPattern(nullptr),
    fPluralRules(nullptr),
    fLocale(nullptr),
    fInternalStatus(U_ZERO_ERROR) {
    *this = info;
}